

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 anon_unknown.dwarf_3e90a3a::InferXOnlyPubkey
           (XOnlyPubKey *xkey,ParseScriptContext ctx,SigningProvider *provider)

{
  long lVar1;
  __uniq_ptr_impl<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
  _Var2;
  bool bVar3;
  long *plVar4;
  undefined4 in_register_00000034;
  pointer __p;
  long in_FS_OFFSET;
  undefined1 local_ac [4];
  __uniq_ptr_impl<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
  local_a8;
  long *local_a0;
  KeyOriginInfo info;
  CPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  XOnlyPubKey::GetEvenCorrespondingCPubKey
            (&pubkey,(XOnlyPubKey *)CONCAT44(in_register_00000034,ctx));
  plVar4 = (long *)operator_new(0x50);
  *(undefined4 *)(plVar4 + 1) = 0;
  *plVar4 = (long)&PTR__PubkeyProvider_01157e18;
  memcpy((void *)((long)plVar4 + 0xc),&pubkey,0x41);
  *(undefined1 *)((long)plVar4 + 0x4d) = 1;
  info.fingerprint[0] = '\0';
  info.fingerprint[1] = '\0';
  info.fingerprint[2] = '\0';
  info.fingerprint[3] = '\0';
  info._4_4_ = 0;
  local_a0 = plVar4;
  std::
  unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                 *)&info);
  info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = SigningProvider::GetKeyOriginByXOnly
                    (provider,(XOnlyPubKey *)CONCAT44(in_register_00000034,ctx),&info);
  if (bVar3) {
    local_ac[0] = '\0';
    local_ac[1] = '\0';
    local_ac[2] = '\0';
    local_ac[3] = '\0';
    std::
    make_unique<(anonymous_namespace)::OriginPubkeyProvider,int,KeyOriginInfo,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,bool>
              ((int *)&local_a8,(KeyOriginInfo *)local_ac,
               (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                *)&info,(bool *)&local_a0);
    _Var2._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
    .super__Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false>._M_head_impl =
         local_a8._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
         .super__Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false>._M_head_impl;
    local_a8._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
    .super__Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false>._M_head_impl =
         (tuple<(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
          )(_Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
            )0x0;
    *(tuple<(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
      *)(xkey->m_keydata).super_base_blob<256U>.m_data._M_elems =
         _Var2._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
         .super__Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false>._M_head_impl;
    std::
    unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                   *)&local_a8);
    plVar4 = local_a0;
  }
  else {
    *(long **)(xkey->m_keydata).super_base_blob<256U>.m_data._M_elems = plVar4;
    plVar4 = (long *)0x0;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )xkey;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> InferXOnlyPubkey(const XOnlyPubKey& xkey, ParseScriptContext ctx, const SigningProvider& provider)
{
    CPubKey pubkey{xkey.GetEvenCorrespondingCPubKey()};
    std::unique_ptr<PubkeyProvider> key_provider = std::make_unique<ConstPubkeyProvider>(0, pubkey, true);
    KeyOriginInfo info;
    if (provider.GetKeyOriginByXOnly(xkey, info)) {
        return std::make_unique<OriginPubkeyProvider>(0, std::move(info), std::move(key_provider), /*apostrophe=*/false);
    }
    return key_provider;
}